

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O3

void __thiscall
ON_SubDVertexIterator::Internal_Init
          (ON_SubDVertexIterator *this,ON_SubDRef *subd_ref,uint vertex_count,ON_SubDVertex *first,
          ON_SubDVertex *last,ON_SubDComponentPtr component_ptr)

{
  Type TVar1;
  ON_SubDComponentPtr *pOVar2;
  ON_SubDComponentPtr local_28;
  
  pOVar2 = &local_28;
  local_28.m_ptr = component_ptr.m_ptr;
  ON_SubDRef::operator=(&this->m_subd_ref,subd_ref);
  if (((vertex_count != 0) && (first != (ON_SubDVertex *)0x0)) && (last != (ON_SubDVertex *)0x0)) {
    this->m_v_first = first;
    this->m_v_last = last;
    this->m_v_current = first;
    this->m_vertex_count = vertex_count;
    TVar1 = ON_SubDComponentPtr::ComponentType(&local_28);
    if (TVar1 == Unset) {
      pOVar2 = &ON_SubDComponentPtr::Null;
    }
    (this->m_component_ptr).m_ptr = pOVar2->m_ptr;
  }
  return;
}

Assistant:

void ON_SubDVertexIterator::Internal_Init(
  const ON_SubDRef& subd_ref,
  unsigned int vertex_count,
  const ON_SubDVertex* first,
  const ON_SubDVertex* last,
  ON_SubDComponentPtr component_ptr
)
{
  m_subd_ref = subd_ref;
  if (nullptr != first && nullptr != last && vertex_count > 0)
  {
    m_v_first = first;
    m_v_last = last;
    m_v_current = m_v_first;
    m_vertex_count = vertex_count;
    m_component_ptr
      = (ON_SubDComponentPtr::Type::Unset == component_ptr.ComponentType())
      ? ON_SubDComponentPtr::Null
      : component_ptr;
  }
}